

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O2

void libtest::unit_test<libtest::a_plus_b>::gen
               (usize small_gen_num,usize large_gen_num,bool testcase_cache)

{
  bool bVar1;
  int iVar2;
  undefined1 in_CL;
  unit_test<libtest::a_plus_b> *puVar3;
  path input_file_path;
  path output_file_path;
  path local_a8;
  path local_80;
  path local_58;
  
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x24,"[----------] ");
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x100000025,"Generate tests\n");
  if (gen(unsigned_long,unsigned_long,bool)::input_file == '\0') {
    iVar2 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::input_file);
    if (iVar2 != 0) {
      std::ofstream::ofstream(gen(unsigned_long,unsigned_long,bool)::input_file);
      __cxa_atexit(std::ofstream::~ofstream,gen(unsigned_long,unsigned_long,bool)::input_file,
                   &__dso_handle);
      __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::input_file);
    }
  }
  if (gen(unsigned_long,unsigned_long,bool)::output_file == '\0') {
    iVar2 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::output_file);
    if (iVar2 != 0) {
      std::ifstream::ifstream(gen(unsigned_long,unsigned_long,bool)::output_file);
      __cxa_atexit(std::ifstream::~ifstream,gen(unsigned_long,unsigned_long,bool)::output_file,
                   &__dso_handle);
      __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::output_file);
    }
  }
  test_case_dir_abi_cxx11_();
  std::filesystem::create_directory(&input_file_path);
  gen_case_dir_abi_cxx11_();
  std::filesystem::create_directory(&output_file_path);
  std::filesystem::__cxx11::path::~path(&output_file_path);
  std::filesystem::__cxx11::path::~path(&input_file_path);
  for (puVar3 = (unit_test<libtest::a_plus_b> *)0x1; puVar3 <= small_gen_num; puVar3 = puVar3 + 1) {
    small_genfile_path_abi_cxx11_(&input_file_path,puVar3,1,(bool)in_CL);
    small_genfile_path_abi_cxx11_(&output_file_path,puVar3,0,(bool)in_CL);
    if (testcase_cache) {
      bVar1 = std::filesystem::exists(&input_file_path);
      if (!bVar1) goto LAB_001063e1;
    }
    else {
LAB_001063e1:
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ GENERATE ] ");
      std::filesystem::__cxx11::path::filename(&local_58,&input_file_path);
      cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                          (_Ios_Openmode)input_file_path._M_pathname._M_dataplus._M_p);
      a_plus_b::generate_input<libtest::a_plus_b::small_constraints>
                ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
      std::ofstream::close();
      std::ifstream::open(gen(unsigned_long,unsigned_long,bool)::output_file,
                          (_Ios_Openmode)input_file_path._M_pathname._M_dataplus._M_p);
      std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                          (_Ios_Openmode)output_file_path._M_pathname._M_dataplus._M_p);
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ GENERATE ] ");
      std::filesystem::__cxx11::path::filename(&local_80,&output_file_path);
      cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_80);
      std::filesystem::__cxx11::path::~path(&local_80);
      a_plus_b::generate_output
                ((ifstream *)gen(unsigned_long,unsigned_long,bool)::output_file,
                 (ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
      std::ofstream::close();
      std::ifstream::close();
    }
    std::filesystem::__cxx11::path::~path(&output_file_path);
    std::filesystem::__cxx11::path::~path(&input_file_path);
  }
  puVar3 = (unit_test<libtest::a_plus_b> *)0x1;
  do {
    if (large_gen_num < puVar3) {
      return;
    }
    large_genfile_path_abi_cxx11_(&input_file_path,puVar3,1,(bool)in_CL);
    if (testcase_cache) {
      bVar1 = std::filesystem::exists(&input_file_path);
      if (!bVar1) goto LAB_00106510;
    }
    else {
LAB_00106510:
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ GENERATE ] ");
      std::filesystem::__cxx11::path::filename(&local_a8,&input_file_path);
      cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_a8);
      std::filesystem::__cxx11::path::~path(&local_a8);
      std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                          (_Ios_Openmode)input_file_path._M_pathname._M_dataplus._M_p);
      a_plus_b::generate_input<libtest::a_plus_b::large_constraints>
                ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
      std::ofstream::close();
    }
    std::filesystem::__cxx11::path::~path(&input_file_path);
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

static void gen(const usize small_gen_num, const usize large_gen_num, const bool testcase_cache)
    {
        cprintf(base_color, "[----------] "), cprintf(bold_message_color, "Generate tests\n");
        static std::ofstream input_file;
        static std::ifstream output_file;
        fs::create_directory(test_case_dir()), fs::create_directory(gen_case_dir());
        for (usize index = 1; index <= small_gen_num; index++) {
            const fs::path input_file_path = small_genfile_path(index, true), output_file_path = small_genfile_path(index, false);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::small_constraints>(input_file);
            input_file.close(), output_file.open(input_file_path), input_file.open(output_file_path);
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, output_file_path.filename());
            Problem::generate_output(output_file, input_file);
            input_file.close(), output_file.close();
        }
        for (usize index = 1; index <= large_gen_num; index++) {
            const fs::path input_file_path = large_genfile_path(index, true);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::large_constraints>(input_file);
            input_file.close();
        }
    }